

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_keydata.cpp
# Opt level: O0

void __thiscall KeyData_Pubkey1_Test::KeyData_Pubkey1_Test(KeyData_Pubkey1_Test *this)

{
  KeyData_Pubkey1_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__KeyData_Pubkey1_Test_009e26a8;
  return;
}

Assistant:

TEST(KeyData, Pubkey1) {
  Pubkey pubkey1("021362bdf255b304dcd29bfdb6b5c63c68ef7df60e2b1fc156716efe077b794647");
  ByteData fingerprint1("12345678");
  std::vector<uint32_t> array1{0, 1, 2};

  auto check_func = [](const KeyData& obj, const std::vector<uint32_t>& arr_obj) {
    auto obj_arr = obj.GetChildNumArray();
    EXPECT_TRUE(obj.IsValid());
    EXPECT_FALSE(obj.HasPrivkey());
    EXPECT_FALSE(obj.HasExtPubkey());
    EXPECT_FALSE(obj.HasExtPrivkey());
    EXPECT_EQ(arr_obj.size(), obj_arr.size());
    EXPECT_STREQ("0/1/2", obj.GetBip32Path().c_str());
    EXPECT_STREQ("12345678", obj.GetFingerprint().GetHex().c_str());
    EXPECT_STREQ(
        "021362bdf255b304dcd29bfdb6b5c63c68ef7df60e2b1fc156716efe077b794647",
        obj.GetPubkey().GetHex().c_str());
    for (size_t idx=0; idx<arr_obj.size(); ++idx) {
      EXPECT_EQ(arr_obj[idx], obj_arr[idx]);
    }
    EXPECT_STREQ(
        "[12345678/0/1/2]021362bdf255b304dcd29bfdb6b5c63c68ef7df60e2b1fc156716efe077b794647",
        obj.ToString().c_str());
    EXPECT_STREQ("0x0/0x1/0x2",
        obj.GetBip32Path(HardenedType::kApostrophe, true).c_str());
  };

  KeyData obj1(pubkey1, "0/1/2", fingerprint1);
  check_func(obj1, array1);
  KeyData obj2(pubkey1, array1, fingerprint1);
  check_func(obj2, array1);
}